

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O2

int __thiscall ncnn::RNN::forward(RNN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  void *__dest;
  void *__src;
  Mat m_2;
  Mat m_1;
  Mat m;
  Mat m_5;
  Mat m_4;
  Mat local_78;
  
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->num_output,4,opt->workspace_allocator);
  iVar3 = -100;
  if (local_78.data != (void *)0x0) {
    if (local_78.cstep * (long)local_78.c != 0) {
      uVar4 = (int)local_78.cstep * local_78.c;
      uVar5 = 0;
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar7 = uVar5;
      }
      for (; (int)uVar7 != (int)uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)local_78.data + uVar5 * 4) = 0;
      }
      Mat::create(top_blob,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar4 = this->direction;
        if (uVar4 < 2) {
          m.w = (this->weight_xc_data).w;
          m.h = (this->weight_xc_data).h;
          m.data = (this->weight_xc_data).data;
          uVar7 = (this->weight_xc_data).elemsize;
          m.elempack = (this->weight_xc_data).elempack;
          m.allocator = (this->weight_xc_data).allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar7;
          m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m.c = (this->weight_xc_data).d;
          m.d = 1;
          iVar1 = (this->weight_xc_data).dims;
          m.dims = iVar1 + -1;
          m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m.cstep = (long)m.h * (long)m.w;
          }
          m_1.w = (this->bias_c_data).w;
          m_1.h = (this->bias_c_data).h;
          m_1.data = (this->bias_c_data).data;
          uVar7 = (this->bias_c_data).elemsize;
          m_1.elempack = (this->bias_c_data).elempack;
          m_1.allocator = (this->bias_c_data).allocator;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = (undefined4)uVar7;
          m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
          m_1.c = (this->bias_c_data).d;
          m_1.d = 1;
          iVar1 = (this->bias_c_data).dims;
          m_1.dims = iVar1 + -1;
          m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
          if (iVar1 == 4) {
            m_1.cstep = (long)m_1.h * (long)m_1.w;
          }
          m_2.w = (this->weight_hc_data).w;
          m_2.h = (this->weight_hc_data).h;
          m_2.c = (this->weight_hc_data).d;
          m_2.data = (this->weight_hc_data).data;
          m_2.elemsize = (this->weight_hc_data).elemsize;
          m_2.elempack = (this->weight_hc_data).elempack;
          m_2.allocator = (this->weight_hc_data).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          iVar3 = rnn(bottom_blob,top_blob,uVar4,&m,&m_1,&m_2,&local_78,opt);
          if (iVar3 != 0) goto LAB_003545e0;
          uVar4 = this->direction;
        }
        if (uVar4 == 2) {
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.allocator = (Allocator *)0x0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
          iVar3 = -100;
          if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
            cVar6 = '\0';
          }
          else {
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.allocator = (Allocator *)0x0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
            iVar3 = -100;
            if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
              uVar7 = 0;
            }
            else {
              m_2.w = (this->weight_xc_data).w;
              m_2.h = (this->weight_xc_data).h;
              m_2.c = (this->weight_xc_data).d;
              m_2.data = (this->weight_xc_data).data;
              m_2.elemsize = (this->weight_xc_data).elemsize;
              m_2.elempack = (this->weight_xc_data).elempack;
              m_2.allocator = (this->weight_xc_data).allocator;
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_2.dims = iVar1 + -1;
              m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                          m_2.elemsize;
              if (iVar1 == 4) {
                m_2.cstep = (long)m_2.h * (long)m_2.w;
              }
              m_4.w = (this->bias_c_data).w;
              m_4.h = (this->bias_c_data).h;
              m_4.c = (this->bias_c_data).d;
              m_4.data = (this->bias_c_data).data;
              m_4.elemsize = (this->bias_c_data).elemsize;
              m_4.elempack = (this->bias_c_data).elempack;
              m_4.allocator = (this->bias_c_data).allocator;
              m_4.refcount = (int *)0x0;
              m_4.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_4.dims = iVar1 + -1;
              m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                          m_4.elemsize;
              if (iVar1 == 4) {
                m_4.cstep = (long)m_4.h * (long)m_4.w;
              }
              m_5.w = (this->weight_hc_data).w;
              m_5.h = (this->weight_hc_data).h;
              m_5.c = (this->weight_hc_data).d;
              m_5.data = (this->weight_hc_data).data;
              m_5.elemsize = (this->weight_hc_data).elemsize;
              m_5.elempack = (this->weight_hc_data).elempack;
              m_5.allocator = (this->weight_hc_data).allocator;
              m_5.refcount = (int *)0x0;
              m_5.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_5.dims = iVar1 + -1;
              m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                          m_5.elemsize;
              if (iVar1 == 4) {
                m_5.cstep = (long)m_5.h * (long)m_5.w;
              }
              iVar3 = rnn(bottom_blob,&m,0,&m_2,&m_4,&m_5,&local_78,opt);
              uVar7 = 0;
              if (iVar3 == 0) {
                uVar5 = (ulong)(uint)(local_78.c * (int)local_78.cstep);
                if (local_78.c * (int)local_78.cstep < 1) {
                  uVar5 = uVar7;
                }
                for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
                  *(undefined4 *)((long)local_78.data + uVar7 * 4) = 0;
                }
                m_2.w = (this->weight_xc_data).w;
                m_2.h = (this->weight_xc_data).h;
                m_2.elemsize = (this->weight_xc_data).elemsize;
                m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                                   (long)(this->weight_xc_data).data);
                m_2.c = (this->weight_xc_data).d;
                m_2.elempack = (this->weight_xc_data).elempack;
                m_2.allocator = (this->weight_xc_data).allocator;
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                iVar1 = (this->weight_xc_data).dims;
                m_2.dims = iVar1 + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (iVar1 == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                m_4.w = (this->bias_c_data).w;
                m_4.h = (this->bias_c_data).h;
                m_4.elemsize = (this->bias_c_data).elemsize;
                m_4.data = (void *)((this->bias_c_data).cstep * m_4.elemsize +
                                   (long)(this->bias_c_data).data);
                m_4.c = (this->bias_c_data).d;
                m_4.elempack = (this->bias_c_data).elempack;
                m_4.allocator = (this->bias_c_data).allocator;
                m_4.refcount = (int *)0x0;
                m_4.d = 1;
                iVar1 = (this->bias_c_data).dims;
                m_4.dims = iVar1 + -1;
                m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                            m_4.elemsize;
                if (iVar1 == 4) {
                  m_4.cstep = (long)m_4.h * (long)m_4.w;
                }
                m_5.w = (this->weight_hc_data).w;
                m_5.h = (this->weight_hc_data).h;
                m_5.elemsize = (this->weight_hc_data).elemsize;
                m_5.data = (void *)((this->weight_hc_data).cstep * m_5.elemsize +
                                   (long)(this->weight_hc_data).data);
                m_5.c = (this->weight_hc_data).d;
                m_5.elempack = (this->weight_hc_data).elempack;
                m_5.allocator = (this->weight_hc_data).allocator;
                m_5.refcount = (int *)0x0;
                m_5.d = 1;
                iVar1 = (this->weight_hc_data).dims;
                m_5.dims = iVar1 + -1;
                m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                            m_5.elemsize;
                if (iVar1 == 4) {
                  m_5.cstep = (long)m_5.h * (long)m_5.w;
                }
                iVar3 = rnn(bottom_blob,&m_1,1,&m_2,&m_4,&m_5,&local_78,opt);
                uVar7 = 0;
                if (iVar3 == 0) {
                  uVar5 = (ulong)_h;
                  if ((int)_h < 1) {
                    uVar5 = uVar7;
                  }
                  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                    __src = (void *)((long)m_1.w * uVar7 *
                                     CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                    (long)m_1.data);
                    __dest = (void *)((long)top_blob->w * uVar7 * top_blob->elemsize +
                                     (long)top_blob->data);
                    memcpy(__dest,(void *)((long)m.w * uVar7 *
                                           CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                          (long)m.data),(long)this->num_output << 2);
                    memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                           (long)this->num_output << 2);
                  }
                  iVar3 = 0;
                  uVar7 = 1;
                }
              }
            }
            cVar6 = (char)uVar7;
            piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (cVar6 == '\0') goto LAB_003545e0;
        }
        iVar3 = 0;
      }
    }
  }
LAB_003545e0:
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int RNN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);

        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}